

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  undefined1 local_60 [8];
  FilePath output_file_path;
  FilePath output_dir;
  
  FilePath::FilePath((FilePath *)local_60,output_file);
  FilePath::RemoveFileName
            ((FilePath *)((long)&output_file_path.pathname_.field_2 + 8),(FilePath *)local_60);
  bVar1 = FilePath::CreateDirectoriesRecursively
                    ((FilePath *)((long)&output_file_path.pathname_.field_2 + 8));
  if (bVar1) {
    pFVar2 = fopen((output_file->_M_dataplus)._M_p,"w");
    if (pFVar2 != (FILE *)0x0) goto LAB_0024e7ac;
  }
  GTestLog::GTestLog((GTestLog *)((long)&output_dir.pathname_.field_2 + 0xc),GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O2/tests/googletest-prefix/src/googletest/googletest/src/gtest.cc"
                     ,0xbe);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open file \"");
  poVar3 = std::operator<<(poVar3,(string *)output_file);
  std::operator<<(poVar3,"\"");
  GTestLog::~GTestLog((GTestLog *)((long)&output_dir.pathname_.field_2 + 0xc));
  pFVar2 = (FILE *)0x0;
LAB_0024e7ac:
  std::__cxx11::string::~string((string *)(output_file_path.pathname_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  return (FILE *)pFVar2;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}